

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

HRESULT Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::
        GenerateValidPointersMapForBlockType(PAL_FILE *file)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ValidPointersMapTable *validTable;
  InvalidBitsTable *invalidTable;
  BlockInfoMapTable *blockInfoTable;
  BVUnit *pBVar4;
  char16_t *pcVar5;
  undefined8 *in_FS_OFFSET;
  char16 *format_1;
  uint j_2;
  uint i_2;
  char16 *format;
  uint j_1;
  uint i_1;
  uint j;
  uint i;
  BlockInfoMapTable *blockMap;
  InvalidBitsTable *invalid;
  ValidPointersMapTable *valid;
  HRESULT hr;
  PAL_FILE *file_local;
  
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0xcc,"(file != nullptr)","file != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  valid._4_4_ = 0;
  validTable = (ValidPointersMapTable *)malloc(0xc000);
  invalidTable = (InvalidBitsTable *)malloc(0x600);
  blockInfoTable = (BlockInfoMapTable *)malloc(0xc0);
  if (((validTable == (ValidPointersMapTable *)0x0) || (invalidTable == (InvalidBitsTable *)0x0)) ||
     (blockInfoTable == (BlockInfoMapTable *)0x0)) {
    valid._4_4_ = -0x7fffbffb;
  }
  else {
    GenerateValidPointersMap(validTable,invalidTable,blockInfoTable);
    iVar3 = PAL_fwprintf(file,L"#if USE_VPM_TABLE\n");
    if (iVar3 < 0) {
      valid._4_4_ = -0x7fffbffb;
    }
    else {
      iVar3 = PAL_fwprintf(file,
                           L"const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n"
                          );
      if (iVar3 < 0) {
        valid._4_4_ = -0x7fffbffb;
      }
      else {
        for (i_1 = 0; i_1 < 0x30; i_1 = i_1 + 1) {
          iVar3 = PAL_fwprintf(file,L"    {\n        ");
          if (iVar3 < 0) {
            valid._4_4_ = -0x7fffbffb;
            goto LAB_002eb2bd;
          }
          for (j_1 = 0; j_1 < 0x200; j_1 = j_1 + 1) {
            pcVar5 = L"0x%04hX";
            if (j_1 < 0x1ff) {
              pcVar5 = L"0x%04hX, ";
            }
            iVar3 = PAL_fwprintf(file,pcVar5,(ulong)(*validTable)[i_1][j_1]);
            if (iVar3 < 0) {
              valid._4_4_ = -0x7fffbffb;
              goto LAB_002eb2bd;
            }
          }
          pcVar5 = L"\n    }\n";
          if (i_1 < 0x2f) {
            pcVar5 = L"\n    },\n";
          }
          iVar3 = PAL_fwprintf(file,pcVar5);
          if (iVar3 < 0) {
            valid._4_4_ = -0x7fffbffb;
            goto LAB_002eb2bd;
          }
        }
        iVar3 = PAL_fwprintf(file,L"};\n");
        if (iVar3 < 0) {
          valid._4_4_ = -0x7fffbffb;
        }
        else {
          iVar3 = PAL_fwprintf(file,L"#endif // USE_VPM_TABLE\n\n");
          if (iVar3 < 0) {
            valid._4_4_ = -0x7fffbffb;
          }
          else {
            iVar3 = PAL_fwprintf(file,
                                 L"const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n"
                                );
            if (iVar3 < 0) {
              valid._4_4_ = -0x7fffbffb;
            }
            else {
              for (format._4_4_ = 0; format._4_4_ < 0x30; format._4_4_ = format._4_4_ + 1) {
                iVar3 = PAL_fwprintf(file,L"    {\n        ");
                if (iVar3 < 0) {
                  valid._4_4_ = -0x7fffbffb;
                  goto LAB_002eb2bd;
                }
                for (format._0_4_ = 0; (uint)format < 4; format._0_4_ = (uint)format + 1) {
                  pcVar5 = L"0x%016I64X";
                  if ((uint)format < 3) {
                    pcVar5 = L"0x%016I64X, ";
                  }
                  pBVar4 = BVStatic<256UL>::GetRawData(*invalidTable + format._4_4_);
                  iVar3 = PAL_fwprintf(file,pcVar5,pBVar4[(uint)format].word);
                  if (iVar3 < 0) {
                    valid._4_4_ = -0x7fffbffb;
                    goto LAB_002eb2bd;
                  }
                }
                pcVar5 = L"\n    }\n";
                if (format._4_4_ < 0x2f) {
                  pcVar5 = L"\n    },\n";
                }
                iVar3 = PAL_fwprintf(file,pcVar5);
                if (iVar3 < 0) {
                  valid._4_4_ = -0x7fffbffb;
                  goto LAB_002eb2bd;
                }
              }
              iVar3 = PAL_fwprintf(file,
                                   L"};\n// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\nconst HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n"
                                  );
              if (iVar3 < 0) {
                valid._4_4_ = -0x7fffbffb;
              }
              else {
                iVar3 = PAL_fwprintf(file,
                                     L"const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n"
                                    );
                if (iVar3 < 0) {
                  valid._4_4_ = -0x7fffbffb;
                }
                else {
                  for (format_1._4_4_ = 0; format_1._4_4_ < 0x30;
                      format_1._4_4_ = format_1._4_4_ + 1) {
                    iVar3 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",(ulong)format_1._4_4_
                                         ,(ulong)(format_1._4_4_ * 0x10 + 0x10));
                    if (iVar3 < 0) {
                      valid._4_4_ = -0x7fffbffb;
                      goto LAB_002eb2bd;
                    }
                    iVar3 = PAL_fwprintf(file,L"    {\n");
                    if (iVar3 < 0) {
                      valid._4_4_ = -0x7fffbffb;
                      goto LAB_002eb2bd;
                    }
                    bVar2 = false;
                    while (!bVar2) {
                      iVar3 = PAL_fwprintf(file,L"        { ");
                      if (iVar3 < 0) {
                        valid._4_4_ = -0x7fffbffb;
                        goto LAB_002eb2bd;
                      }
                      iVar3 = PAL_fwprintf(file,L"0x%04hX, 0x%04hX",
                                           (ulong)(*blockInfoTable)[format_1._4_4_][0].
                                                  lastObjectIndexOnPage,
                                           (ulong)(*blockInfoTable)[format_1._4_4_][0].
                                                  pageObjectCount);
                      if (iVar3 < 0) {
                        valid._4_4_ = -0x7fffbffb;
                        goto LAB_002eb2bd;
                      }
                      iVar3 = PAL_fwprintf(file,L" }\n");
                      if (iVar3 < 0) {
                        valid._4_4_ = -0x7fffbffb;
                        goto LAB_002eb2bd;
                      }
                      bVar2 = true;
                    }
                    pcVar5 = L"\n    }\n";
                    if (format_1._4_4_ < 0x2f) {
                      pcVar5 = L"\n    },\n";
                    }
                    iVar3 = PAL_fwprintf(file,pcVar5 + 1);
                    if (iVar3 < 0) {
                      valid._4_4_ = -0x7fffbffb;
                      goto LAB_002eb2bd;
                    }
                  }
                  iVar3 = PAL_fwprintf(file,L"};\n");
                  if (iVar3 < 0) {
                    valid._4_4_ = -0x7fffbffb;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_002eb2bd:
  ::free(validTable);
  ::free(invalidTable);
  return valid._4_4_;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(FILE* file)
{
#define IfErrorGotoCleanup(result) if ((result) < 0) { hr = E_FAIL; goto cleanup; }

    Assert(file != nullptr);
    HRESULT hr = S_OK;

    // Use heap to allocate the table so we don't bloat the stack (~64k). We only use this function
    // to generate headers as part of testing.
    ValidPointersMapTable *valid = (ValidPointersMapTable *)malloc(sizeof(ValidPointersMapTable));
    InvalidBitsTable *invalid = (InvalidBitsTable *)malloc(sizeof(InvalidBitsTable));
    BlockInfoMapTable *blockMap = (BlockInfoMapTable*)malloc(sizeof(BlockInfoMapTable));

    if (valid == nullptr || invalid == nullptr || blockMap == nullptr)
    {
        hr = E_FAIL;
        goto cleanup;
    }
    GenerateValidPointersMap(valid, *invalid, *blockMap);

    IfErrorGotoCleanup(fwprintf(file, _u("#if USE_VPM_TABLE\n")))
    IfErrorGotoCleanup(fwprintf(file, _u("const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n")));
    // Generate the full buffer.
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));
        for (unsigned j = 0; j < rowSize; ++j)
        {
            IfErrorGotoCleanup(fwprintf(
                file,
                (j < rowSize - 1) ? _u("0x%04hX, ") : _u("0x%04hX"),
                (*valid)[i][j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));
    IfErrorGotoCleanup(fwprintf(file, _u("#endif // USE_VPM_TABLE\n\n")))

    // Generate the invalid bitvectors.
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));

        for (unsigned j = 0; j < (*invalid)[i].wordCount; ++j)
        {
            const char16 *format = (j < (*invalid)[i].wordCount - 1) ?
#if defined(TARGET_32)
                _u("0x%08X, ") : _u("0x%08X")
#elif defined(TARGET_64)
                _u("0x%016I64X, ") : _u("0x%016I64X")
#else
#error "Platform is not handled"
#endif
                ;
            IfErrorGotoCleanup(fwprintf(file, format, (*invalid)[i].GetRawData()[j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(
        file,
        _u("};\n")
        _u("// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\n")
        _u("const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n")
        _u("    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n")));

    // Generate the block map table
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    // Bucket: %u, Size: %d\n"), i, (int) (HeapConstants::ObjectGranularity + (i * SmallAllocationBlockAttributes::BucketGranularity))));
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n")));

        for (unsigned j = 0; j < SmallAllocationBlockAttributes::PageCount; ++j)
        {
            IfErrorGotoCleanup(fwprintf(file, _u("        { ")));

            const char16 *format = _u("0x%04hX, 0x%04hX");
            IfErrorGotoCleanup(fwprintf(file, format, (*blockMap)[i][j].lastObjectIndexOnPage, (*blockMap)[i][j].pageObjectCount));
#if USE_FEWER_PAGES_PER_BLOCK
            IfErrorGotoCleanup(fwprintf(file, _u(" }\n")));
#else
            IfErrorGotoCleanup(fwprintf(file, (j < SmallAllocationBlockAttributes::PageCount - 1 ? _u(" },\n") : _u(" }\n"))));
#endif
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("    },\n") : _u("    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));

cleanup:
#undef IfErrorGotoCleanup
    free(valid);
    free(invalid);
    return hr;
}